

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O1

string * __thiscall
iutest::internal::
FormatForComparisonFailureMessage<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
          (string *__return_storage_ptr__,internal *this,vector<int,_std::allocator<int>_> *value,
          vector<int,_std::allocator<int>_> *param_2)

{
  iu_global_format_stringstream strm;
  undefined1 auStack_198 [392];
  
  iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)auStack_198);
  detail::DefaultPrintTo<std::vector<int,std::allocator<int>>>(0,this,auStack_198 + 0x10);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)auStack_198);
  std::ios_base::~ios_base((ios_base *)(auStack_198 + 0x80));
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string FormatForComparisonFailureMessage(const T1& value, const T2& /*other_operand*/)
{
    return PrintToString(value);
}